

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_fwd_txfm2d_32x64_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RSI;
  int col_1;
  int col;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [2048];
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffdf50;
  undefined4 local_20a8;
  undefined4 in_stack_ffffffffffffdf5c;
  int iVar1;
  int in_stack_ffffffffffffe094;
  int32_t *in_stack_ffffffffffffe098;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffe0a0;
  int in_stack_ffffffffffffe0ac;
  int32_t *in_stack_ffffffffffffe0b0;
  int16_t *in_stack_ffffffffffffe0b8;
  
  av1_get_fwd_txfm_cfg
            ((TX_TYPE)((uint)in_stack_ffffffffffffdf5c >> 0x18),
             (TX_SIZE)((uint)in_stack_ffffffffffffdf5c >> 0x10),in_stack_ffffffffffffdf50);
  fwd_txfm2d_c(in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0ac,
               in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,in_stack_ffffffffffffe094);
  for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 1) {
    memset((void *)(in_RSI + (long)(iVar1 << 6) * 4 + 0x80),0,0x80);
  }
  for (local_20a8 = 1; local_20a8 < 0x20; local_20a8 = local_20a8 + 1) {
    memcpy((void *)(in_RSI + (long)(local_20a8 << 5) * 4),
           (void *)(in_RSI + (long)(local_20a8 << 6) * 4),0x80);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x64_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(32, int32_t, txfm_buf[32 * 64]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_32X64, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out right 32x32 area.
  for (int col = 0; col < 32; ++col) {
    memset(output + col * 64 + 32, 0, 32 * sizeof(*output));
  }
  // Re-pack non-zero coeffs in the first 32x32 indices.
  for (int col = 1; col < 32; ++col) {
    memcpy(output + col * 32, output + col * 64, 32 * sizeof(*output));
  }
}